

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt8 u)

{
  if ((this->style->numberFormat).radix == '\x10') {
    sprintx(&this->ptr,(ulong)u.raw,&this->style->numberFormat,2);
  }
  else {
    sprintd(&this->ptr,(ulong)u.raw,3);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt8 u)
{
    if (style.numberFormat.radix == 16) {
        sprintx(ptr, u.raw, style.numberFormat, 2);
    } else {
        sprintd(ptr, u.raw, 3);
    }
    return *this;
}